

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O3

LINK_HANDLE
create_link(role link_role,SESSION_HANDLE session_handle,AMQP_MESSENGER_LINK_CONFIG *link_config,
           char *iothub_host_fqdn,char *device_id,char *module_id)

{
  MAP_HANDLE handle;
  SESSION_HANDLE session;
  int iVar1;
  UNIQUEID_RESULT UVar2;
  MAP_RESULT MVar3;
  STRING_HANDLE handle_00;
  LOGGER_LOG p_Var4;
  STRING_HANDLE handle_01;
  STRING_HANDLE handle_02;
  AMQP_VALUE pAVar5;
  SESSION_HANDLE target;
  LINK_HANDLE link;
  AMQP_VALUE map;
  AMQP_VALUE value;
  char *pcVar6;
  STRING_HANDLE handle_03;
  ulong uVar7;
  STRING_HANDLE handle_04;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  char **keys;
  char **values;
  char **local_58;
  SESSION_HANDLE local_50;
  AMQP_VALUE local_48;
  ulong local_40;
  char **local_38;
  
  pcVar8 = (&link_config->source_suffix)[!link_role];
  local_50 = session_handle;
  handle_00 = STRING_new();
  if (handle_00 == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link_address",0x129,1,"failed creating link_address (STRING_new failed)");
    }
    goto LAB_0013d95d;
  }
  if (module_id == (char *)0x0) {
    iVar1 = STRING_sprintf(handle_00,"amqps://%s/devices/%s/%s",iothub_host_fqdn,device_id,pcVar8);
    if (iVar1 == 0) goto LAB_0013d9a1;
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar8 = "Failed creating the link_address (STRING_sprintf failed)";
      iVar1 = 0x13a;
      goto LAB_0013d948;
    }
  }
  else {
    iVar1 = STRING_sprintf(handle_00,"amqps://%s/devices/%s/modules/%s/%s",iothub_host_fqdn,
                           device_id,module_id,pcVar8);
    if (iVar1 == 0) {
LAB_0013d9a1:
      pcVar8 = (char *)calloc(1,0x26);
      if (pcVar8 == (char *)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"create_link_name",0x163,1,
                    "Failed generating an unique tag (calloc failed), size:%zu",0x26);
        }
      }
      else {
        UVar2 = UniqueId_Generate(pcVar8,0x25);
        if (UVar2 == UNIQUEID_OK) {
          handle_01 = STRING_new();
          if (handle_01 == (STRING_HANDLE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              pcVar6 = "Failed generating an unique tag (STRING_new failed)";
              iVar1 = 0x16f;
              goto LAB_0013daee;
            }
          }
          else {
            pcVar6 = "link-snd";
            if (link_role) {
              pcVar6 = "link-rcv";
            }
            iVar1 = STRING_sprintf(handle_01,"%s-%s-%s",pcVar6,device_id,pcVar8);
            if (iVar1 == 0) {
              free(pcVar8);
              if (link_role) {
                handle_02 = create_link_terminus_name(handle_01,"target");
                handle_03 = handle_02;
                handle_04 = handle_00;
                if (handle_02 == (STRING_HANDLE)0x0) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                              ,"create_link_terminus",499,1,"Failed creating terminus name");
                  }
                  handle_02 = (STRING_HANDLE)0x0;
                  goto LAB_0013df4c;
                }
LAB_0013dbae:
                pcVar8 = STRING_c_str(handle_04);
                pcVar6 = STRING_c_str(handle_03);
                if (pcVar6 == (char *)0x0 || pcVar8 == (char *)0x0) goto LAB_0013df4c;
                pAVar5 = messaging_create_source(pcVar8);
                if (pAVar5 == (AMQP_VALUE)0x0) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013df89;
                  pcVar8 = "Failed creating link source";
                  iVar1 = 0x207;
                  goto LAB_0013df7e;
                }
                target = (SESSION_HANDLE)messaging_create_target(pcVar6);
                if (target == (SESSION_HANDLE)0x0) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                              ,"create_link_terminus",0x20e,1,"Failed creating link target");
                  }
                  amqpvalue_destroy(pAVar5);
                  goto LAB_0013df89;
                }
                STRING_delete(handle_02);
                pcVar8 = STRING_c_str(handle_01);
                session = local_50;
                local_50 = target;
                link = link_create(session,pcVar8,link_role,pAVar5,(AMQP_VALUE)target);
                if (link == (LINK_HANDLE)0x0) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013e0d6;
                  link = (LINK_HANDLE)0x0;
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                            ,"create_link",0x23c,1,"Failed creating the AMQP link");
                }
                else {
                  iVar1 = link_set_max_message_size(link,0xffffffffffffffff);
                  if ((iVar1 != 0) &&
                     (p_Var4 = xlogging_get_log_function(), p_Var4 != (LOGGER_LOG)0x0)) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                              ,"create_link",0x242,1,"Failed setting link max message size.");
                  }
                  handle = link_config->attach_properties;
                  if (handle != (MAP_HANDLE)0x0) {
                    map = amqpvalue_create_map();
                    if (map == (AMQP_VALUE)0x0) {
                      p_Var4 = xlogging_get_log_function();
                      if (p_Var4 != (LOGGER_LOG)0x0) {
                        (*p_Var4)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                                  ,"add_link_attach_properties",0x193,1,
                                  "Failed to create the map for attach properties.");
                      }
                    }
                    else {
                      MVar3 = Map_GetInternals(handle,&local_58,&local_38,&local_40);
                      if (MVar3 == MAP_OK) {
                        if (local_40 != 0) {
                          uVar7 = 1;
                          local_48 = pAVar5;
                          do {
                            pAVar5 = amqpvalue_create_symbol(local_58[uVar7 - 1]);
                            if (pAVar5 == (AMQP_VALUE)0x0) {
                              p_Var4 = xlogging_get_log_function();
                              pAVar5 = local_48;
                              if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013e08d;
                              pcVar8 = "Failed creating AMQP_VALUE For key %s.";
                              iVar1 = 0x1ad;
                              goto LAB_0013e082;
                            }
                            value = amqpvalue_create_string(local_38[uVar7 - 1]);
                            if (value == (AMQP_VALUE)0x0) {
                              p_Var4 = xlogging_get_log_function();
                              if (p_Var4 == (LOGGER_LOG)0x0) {
                                bVar10 = false;
                              }
                              else {
                                bVar10 = false;
                                (*p_Var4)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                                          ,"add_link_attach_properties",0x1b4,1,
                                          "Failed creating AMQP_VALUE For key %s value",
                                          local_58[uVar7 - 1]);
                              }
                            }
                            else {
                              iVar1 = amqpvalue_set_map_value(map,pAVar5,value);
                              bVar10 = iVar1 == 0;
                              if ((!bVar10) &&
                                 (p_Var4 = xlogging_get_log_function(), p_Var4 != (LOGGER_LOG)0x0))
                              {
                                (*p_Var4)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                                          ,"add_link_attach_properties",0x1bb,1,
                                          "Failed adding property %s to map",local_58[uVar7 - 1]);
                              }
                              amqpvalue_destroy(value);
                            }
                            amqpvalue_destroy(pAVar5);
                          } while ((bVar10) && (bVar9 = uVar7 < local_40, uVar7 = uVar7 + 1, bVar9))
                          ;
                          pAVar5 = local_48;
                          if (!bVar10) goto LAB_0013e08d;
                        }
                        iVar1 = link_set_attach_properties(link,map);
                        if (iVar1 == 0) {
                          amqpvalue_destroy(map);
                          goto LAB_0013e0e8;
                        }
                        p_Var4 = xlogging_get_log_function();
                        if (p_Var4 != (LOGGER_LOG)0x0) {
                          pcVar8 = "Failed attaching properties to link";
                          iVar1 = 0x1ca;
                          goto LAB_0013e082;
                        }
                      }
                      else {
                        p_Var4 = xlogging_get_log_function();
                        if (p_Var4 != (LOGGER_LOG)0x0) {
                          pcVar8 = "failed getting user defined properties details.";
                          iVar1 = 0x19e;
LAB_0013e082:
                          (*p_Var4)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                                    ,"add_link_attach_properties",iVar1,1,pcVar8);
                        }
                      }
LAB_0013e08d:
                      amqpvalue_destroy(map);
                    }
                    p_Var4 = xlogging_get_log_function();
                    if (p_Var4 != (LOGGER_LOG)0x0) {
                      (*p_Var4)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                                ,"create_link",0x248,1,"Failed setting link attach properties");
                    }
                    link_destroy(link);
LAB_0013e0d6:
                    link = (LINK_HANDLE)0x0;
                  }
                }
LAB_0013e0e8:
                amqpvalue_destroy(pAVar5);
                amqpvalue_destroy((AMQP_VALUE)local_50);
              }
              else {
                handle_02 = create_link_terminus_name(handle_01,"source");
                handle_03 = handle_00;
                handle_04 = handle_02;
                if (handle_02 != (STRING_HANDLE)0x0) goto LAB_0013dbae;
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                            ,"create_link_terminus",0x1e5,1,"Failed creating terminus name");
                }
                handle_02 = (STRING_HANDLE)0x0;
LAB_0013df4c:
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  pcVar8 = "Failed creating link source and/or target name (source=%p, target=%p)";
                  iVar1 = 0x200;
LAB_0013df7e:
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                            ,"create_link_terminus",iVar1,1,pcVar8);
                }
LAB_0013df89:
                STRING_delete(handle_02);
                link = (LINK_HANDLE)0x0;
              }
              STRING_delete(handle_01);
              goto LAB_0013db3d;
            }
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                        ,"create_link_name",0x173,1,
                        "Failed generating an unique tag (STRING_sprintf failed)");
            }
            STRING_delete(handle_01);
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar6 = "Failed generating an unique tag (UniqueId_Generate failed)";
            iVar1 = 0x16a;
LAB_0013daee:
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"create_link_name",iVar1,1,pcVar6);
          }
        }
        free(pcVar8);
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) {
        link = (LINK_HANDLE)0x0;
      }
      else {
        link = (LINK_HANDLE)0x0;
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"create_link",0x230,1,"Failed creating the link name");
      }
LAB_0013db3d:
      STRING_delete(handle_00);
      return link;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar8 = "Failed creating the link_address for a module (STRING_sprintf failed)";
      iVar1 = 0x131;
LAB_0013d948:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link_address",iVar1,1,pcVar8);
    }
  }
  STRING_delete(handle_00);
LAB_0013d95d:
  p_Var4 = xlogging_get_log_function();
  if (p_Var4 != (LOGGER_LOG)0x0) {
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
              ,"create_link",0x227,1,
              "Failed creating the message sender (failed creating the \'link_address\')");
  }
  return (LINK_HANDLE)0x0;
}

Assistant:

static LINK_HANDLE create_link(role link_role, SESSION_HANDLE session_handle, AMQP_MESSENGER_LINK_CONFIG* link_config, const char* iothub_host_fqdn, const char* device_id, const char* module_id)
{
    LINK_HANDLE result = NULL;
    STRING_HANDLE link_address;

    if ((link_address = create_link_address(iothub_host_fqdn, device_id, module_id, (link_role == role_sender ? link_config->target_suffix : link_config->source_suffix))) == NULL)
    {
        LogError("Failed creating the message sender (failed creating the 'link_address')");
        result = NULL;
    }
    else
    {
        STRING_HANDLE link_name;

        if ((link_name = create_link_name(link_role, device_id)) == NULL)
        {
            LogError("Failed creating the link name");
            result = NULL;
        }
        else
        {
            AMQP_VALUE source = NULL;
            AMQP_VALUE target = NULL;

            if (create_link_terminus(link_role, link_name, link_address, &source, &target) == RESULT_OK)
            {
                if ((result = link_create(session_handle, STRING_c_str(link_name), link_role, source, target)) == NULL)
                {
                    LogError("Failed creating the AMQP link");
                }
                else
                {
                    if (link_set_max_message_size(result, MESSAGE_SENDER_MAX_LINK_SIZE) != RESULT_OK)
                    {
                        LogError("Failed setting link max message size.");
                    }

                    if (link_config->attach_properties != NULL &&
                        add_link_attach_properties(result, link_config->attach_properties) != RESULT_OK)
                    {
                        LogError("Failed setting link attach properties");
                        link_destroy(result);
                        result = NULL;
                    }
                }

                amqpvalue_destroy(source);
                amqpvalue_destroy(target);
            }

            STRING_delete(link_name);
        }

        STRING_delete(link_address);
    }

    return result;
}